

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::converter::ConvertFieldMaskPath
          (string *__return_storage_ptr__,converter *this,StringPiece path,
          ConverterCallback *converter)

{
  char cVar1;
  undefined7 extraout_var;
  char *i;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  StringPiece __args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece)>
  *local_50;
  undefined1 local_48 [8];
  StringPiece path_local;
  
  local_50 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece)>
              *)path.length_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48 = (undefined1  [8])this;
  path_local.ptr_ = path.ptr_;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar4 = false;
  path_local.length_._4_4_ = 0;
  iVar3 = 0;
  i = (char *)0x0;
  pcVar2 = path.ptr_;
  do {
    if (pcVar2 < i) {
      return __return_storage_ptr__;
    }
    if (bVar4) {
      if (i == pcVar2) {
        return __return_storage_ptr__;
      }
      StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if ((path_local.length_._4_4_ & 1) == 0) {
        cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i);
        bVar4 = true;
        if (cVar1 == '\\') {
          path_local.length_._4_4_ = (uint)CONCAT71(extraout_var,1);
          goto LAB_0032b0f3;
        }
        cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i);
        if (cVar1 == '\"') {
          iVar3 = (int)i + 1;
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
      }
      path_local.length_._4_4_ = 0;
    }
    else {
      if ((((i == pcVar2) ||
           (cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i),
           cVar1 == '.')) ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i),
          cVar1 == '(')) ||
         ((cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i),
          cVar1 == ')' ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i),
          cVar1 == '\"')))) {
        __args = StringPiece::substr((StringPiece *)local_48,(long)iVar3,(long)i - (long)iVar3);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece)>
        ::operator()(&local_70,local_50,__args);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_70);
        if (i < path_local.ptr_) {
          StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        iVar3 = (int)i + 1;
      }
      if (i < path_local.ptr_) {
        cVar1 = StringPiece::operator[]((StringPiece *)local_48,(stringpiece_ssize_type)i);
        bVar4 = cVar1 == '\"';
      }
      else {
        bVar4 = false;
      }
    }
LAB_0032b0f3:
    i = i + 1;
    pcVar2 = path_local.ptr_;
  } while( true );
}

Assistant:

std::string ConvertFieldMaskPath(const StringPiece path,
                                 ConverterCallback converter) {
  std::string result;
  result.reserve(path.size() << 1);

  bool is_quoted = false;
  bool is_escaping = false;
  int current_segment_start = 0;

  // Loops until 1 passed the end of the input to make handling the last
  // segment easier.
  for (size_t i = 0; i <= path.size(); ++i) {
    // Outputs quoted string as-is.
    if (is_quoted) {
      if (i == path.size()) {
        break;
      }
      result.push_back(path[i]);
      if (is_escaping) {
        is_escaping = false;
      } else if (path[i] == '\\') {
        is_escaping = true;
      } else if (path[i] == '\"') {
        current_segment_start = i + 1;
        is_quoted = false;
      }
      continue;
    }
    if (i == path.size() || path[i] == '.' || path[i] == '(' ||
        path[i] == ')' || path[i] == '\"') {
      result += converter(
          path.substr(current_segment_start, i - current_segment_start));
      if (i < path.size()) {
        result.push_back(path[i]);
      }
      current_segment_start = i + 1;
    }
    if (i < path.size() && path[i] == '\"') {
      is_quoted = true;
    }
  }
  return result;
}